

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3SegReaderSort(Fts3SegReader **apSegment,int nSegment,int nSuspect,
                      _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp)

{
  Fts3SegReader *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Fts3SegReader **ppFVar7;
  
  iVar4 = nSuspect - (uint)(nSuspect == nSegment);
  if (0 < iVar4) {
    uVar6 = nSuspect - (uint)(nSuspect == nSegment);
    do {
      uVar6 = uVar6 - 1;
      if (iVar4 < nSegment) {
        ppFVar7 = apSegment + (ulong)uVar6 + 1;
        uVar5 = uVar6;
        do {
          iVar3 = (*xCmp)(ppFVar7[-1],*ppFVar7);
          if (iVar3 < 0) break;
          pFVar1 = *ppFVar7;
          *ppFVar7 = ppFVar7[-1];
          ppFVar7[-1] = pFVar1;
          ppFVar7 = ppFVar7 + 1;
          uVar5 = uVar5 + 1;
        } while ((int)uVar5 < nSegment + -1);
      }
      bVar2 = 1 < iVar4;
      iVar4 = iVar4 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

static void fts3SegReaderSort(
  Fts3SegReader **apSegment,                     /* Array to sort entries of */
  int nSegment,                                  /* Size of apSegment array */
  int nSuspect,                                  /* Unsorted entry count */
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *)  /* Comparison function */
){
  int i;                          /* Iterator variable */

  assert( nSuspect<=nSegment );

  if( nSuspect==nSegment ) nSuspect--;
  for(i=nSuspect-1; i>=0; i--){
    int j;
    for(j=i; j<(nSegment-1); j++){
      Fts3SegReader *pTmp;
      if( xCmp(apSegment[j], apSegment[j+1])<0 ) break;
      pTmp = apSegment[j+1];
      apSegment[j+1] = apSegment[j];
      apSegment[j] = pTmp;
    }
  }

#ifndef NDEBUG
  /* Check that the list really is sorted now. */
  for(i=0; i<(nSuspect-1); i++){
    assert( xCmp(apSegment[i], apSegment[i+1])<0 );
  }
#endif
}